

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

Status __thiscall google::protobuf::File::CreateDir(File *this,string *name,int mode)

{
  int iVar1;
  string_view message;
  File aFStack_18 [16];
  
  if ((name->_M_string_length != 0) && ((name->_M_dataplus)._M_p[name->_M_string_length - 1] == '.')
     ) {
    CreateDir(aFStack_18);
  }
  iVar1 = mkdir((name->_M_dataplus)._M_p,mode);
  if (iVar1 == 0) {
    *(undefined8 *)this = 1;
  }
  else {
    message._M_str = (char *)0x1a;
    message._M_len = (size_t)this;
    absl::lts_20250127::InternalError(message);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status File::CreateDir(const std::string& name, int mode) {
  if (!name.empty()) {
    ABSL_CHECK(name[name.size() - 1] != '.');
  }
  if (mkdir(name.c_str(), mode) != 0) {
    return absl::InternalError("Failed to create directory");
  }
  return absl::OkStatus();
}